

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall
SQCompiler::ParseTableOrClass(SQCompiler *this,SQInteger separator,SQInteger terminator)

{
  SQFuncState *pSVar1;
  long lVar2;
  SQInteger SVar3;
  SQInteger SVar4;
  SQInteger SVar5;
  uint uVar6;
  ulong unaff_RBP;
  SQFuncState *pSVar7;
  long val;
  SQObject SVar8;
  SQInstruction local_78;
  SQObject local_70;
  uint local_5c;
  SQLexer *local_58;
  SQInteger local_50;
  undefined4 local_44;
  SQUnsignedInteger local_40;
  SQInteger local_38;
  
  lVar2 = this->_token;
  local_40 = (this->_fs->_instructions)._size;
  local_38 = terminator;
  if (lVar2 == terminator) {
    val = 0;
  }
  else {
    local_58 = &this->_lex;
    val = 0;
    local_50 = separator;
    do {
      if (separator == 0x3b) {
        if (lVar2 == 0x140) {
          pSVar7 = this->_fs;
          SVar5 = SQFuncState::PushTarget(pSVar7,-1);
          local_70._5_1_ = (char)SVar5;
          local_70._4_1_ = 0x21;
          local_70._type = 0;
          local_70._6_2_ = 0;
          SQFuncState::AddInstruction(pSVar7,(SQInstruction *)&local_70);
          SVar5 = SQLexer::Lex(local_58);
          this->_token = SVar5;
          ParseTableOrClass(this,0x2c,0x141);
          lVar2 = this->_token;
          unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),1);
        }
        else {
          unaff_RBP = 0;
        }
        if (lVar2 == 0x142) {
          lVar2 = SQLexer::Lex(local_58);
          this->_token = lVar2;
          local_44 = (undefined4)CONCAT71((int7)((ulong)lVar2 >> 8),2);
        }
        else {
          local_44 = 0;
        }
      }
      else {
        local_44 = 0;
        unaff_RBP = 0;
      }
      uVar6 = (uint)unaff_RBP;
      if (lVar2 < 0x11d) {
        if (lVar2 == 0x5b) {
          SVar5 = SQLexer::Lex(local_58);
          this->_token = SVar5;
          CommaExpr(this);
          Expect(this,0x5d);
          SVar5 = 0x3d;
        }
        else {
          if (lVar2 != 0x103) goto LAB_0011e393;
          pSVar7 = this->_fs;
          if (separator != 0x2c) goto LAB_0011e4a3;
          SVar5 = SQFuncState::PushTarget(pSVar7,-1);
          unaff_RBP = unaff_RBP & 0xffffffff;
          pSVar1 = this->_fs;
          SVar8 = Expect(this,0x103);
          separator = local_50;
          local_70._unVal = SVar8._unVal;
          local_70._type = SVar8._type;
          SVar3 = SQFuncState::GetConstant(pSVar1,&local_70);
          local_78.op = '\x01';
          local_78._arg0 = (uchar)SVar5;
          local_78._arg1 = (SQInt32)SVar3;
          local_78._arg2 = '\0';
          local_78._arg3 = '\0';
          SQFuncState::AddInstruction(pSVar7,&local_78);
          SVar5 = 0x3a;
        }
        Expect(this,SVar5);
        Expression(this);
      }
      else {
        if ((lVar2 == 0x11d) || (lVar2 == 0x136)) {
          SVar5 = SQLexer::Lex(local_58);
          this->_token = SVar5;
          if (lVar2 == 0x11d) {
            local_5c = uVar6;
            SVar8 = Expect(this,0x102);
          }
          else {
            local_5c = uVar6;
            SVar8 = SQFuncState::CreateString(this->_fs,"constructor",-1);
          }
          local_70._unVal = SVar8._unVal;
          local_70._type = SVar8._type;
          Expect(this,0x28);
          pSVar7 = this->_fs;
          SVar5 = SQFuncState::PushTarget(pSVar7,-1);
          SVar3 = SQFuncState::GetConstant(this->_fs,&local_70);
          local_78.op = '\x01';
          local_78._arg0 = (uchar)SVar5;
          local_78._arg1 = (SQInt32)SVar3;
          local_78._arg2 = '\0';
          local_78._arg3 = '\0';
          SQFuncState::AddInstruction(pSVar7,&local_78);
          CreateFunction(this,&local_70,false);
          pSVar7 = this->_fs;
          SVar5 = SQFuncState::PushTarget(pSVar7,-1);
          local_78.op = '0';
          local_78._arg0 = (uchar)SVar5;
          local_78._arg1 = (int)(this->_fs->_functions)._size + -1;
          local_78._arg2 = '\0';
          local_78._arg3 = '\0';
          SQFuncState::AddInstruction(pSVar7,&local_78);
        }
        else {
LAB_0011e393:
          pSVar7 = this->_fs;
LAB_0011e4a3:
          local_5c = uVar6;
          SVar5 = SQFuncState::PushTarget(pSVar7,-1);
          pSVar1 = this->_fs;
          SVar8 = Expect(this,0x102);
          local_70._unVal = SVar8._unVal;
          local_70._type = SVar8._type;
          SVar3 = SQFuncState::GetConstant(pSVar1,&local_70);
          local_78.op = '\x01';
          local_78._arg0 = (uchar)SVar5;
          local_78._arg1 = (SQInt32)SVar3;
          local_78._arg2 = '\0';
          local_78._arg3 = '\0';
          SQFuncState::AddInstruction(pSVar7,&local_78);
          Expect(this,0x3d);
          Expression(this);
        }
        unaff_RBP = (ulong)local_5c;
        separator = local_50;
      }
      if (this->_token == separator) {
        SVar5 = SQLexer::Lex(local_58);
        this->_token = SVar5;
      }
      SVar5 = SQFuncState::PopTarget(this->_fs);
      SVar3 = SQFuncState::PopTarget(this->_fs);
      if ((byte)unaff_RBP != 0) {
        SQFuncState::PopTarget(this->_fs);
      }
      SVar4 = SQFuncState::TopTarget(this->_fs);
      if (separator == 0x2c) {
        pSVar7 = this->_fs;
        local_70._4_2_ = 0xff0b;
      }
      else {
        local_70._5_1_ = (byte)unaff_RBP | (byte)local_44;
        unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),local_70._5_1_);
        pSVar7 = this->_fs;
        local_70._4_1_ = 0x3a;
      }
      local_70._type = (SQObjectType)SVar4;
      local_70._7_1_ = (char)SVar5;
      local_70._6_1_ = (char)SVar3;
      SQFuncState::AddInstruction(pSVar7,(SQInstruction *)&local_70);
      lVar2 = this->_token;
      val = val + 1;
    } while (lVar2 != local_38);
  }
  if (separator == 0x2c) {
    SQFuncState::SetIntructionParam(this->_fs,local_40 - 1,1,val);
  }
  SVar5 = SQLexer::Lex(&this->_lex);
  this->_token = SVar5;
  return;
}

Assistant:

void ParseTableOrClass(SQInteger separator,SQInteger terminator)
    {
        SQInteger tpos = _fs->GetCurrentPos(),nkeys = 0;
        while(_token != terminator) {
            bool hasattrs = false;
            bool isstatic = false;
            //check if is an attribute
            if(separator == ';') {
                if(_token == TK_ATTR_OPEN) {
                    _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,NOT_TABLE); Lex();
                    ParseTableOrClass(',',TK_ATTR_CLOSE);
                    hasattrs = true;
                }
                if(_token == TK_STATIC) {
                    isstatic = true;
                    Lex();
                }
            }
            switch(_token) {
            case TK_FUNCTION:
            case TK_CONSTRUCTOR:{
                SQInteger tk = _token;
                Lex();
                SQObject id = tk == TK_FUNCTION ? Expect(TK_IDENTIFIER) : _fs->CreateString(_SC("constructor"));
                Expect(_SC('('));
                _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(id));
                CreateFunction(id);
                _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, 0);
                                }
                                break;
            case _SC('['):
                Lex(); CommaExpr(); Expect(_SC(']'));
                Expect(_SC('=')); Expression();
                break;
            case TK_STRING_LITERAL: //JSON
                if(separator == ',') { //only works for tables
                    _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(Expect(TK_STRING_LITERAL)));
                    Expect(_SC(':')); Expression();
                    break;
                }
            default :
                _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(Expect(TK_IDENTIFIER)));
                Expect(_SC('=')); Expression();
            }
            if(_token == separator) Lex();//optional comma/semicolon
            nkeys++;
            SQInteger val = _fs->PopTarget();
            SQInteger key = _fs->PopTarget();
            SQInteger attrs = hasattrs ? _fs->PopTarget():-1;
            ((void)attrs);
            assert((hasattrs && (attrs == key-1)) || !hasattrs);
            unsigned char flags = (hasattrs?NEW_SLOT_ATTRIBUTES_FLAG:0)|(isstatic?NEW_SLOT_STATIC_FLAG:0);
            SQInteger table = _fs->TopTarget(); //<<BECAUSE OF THIS NO COMMON EMIT FUNC IS POSSIBLE
            if(separator == _SC(',')) { //hack recognizes a table from the separator
                _fs->AddInstruction(_OP_NEWSLOT, 0xFF, table, key, val);
            }
            else {
                _fs->AddInstruction(_OP_NEWSLOTA, flags, table, key, val); //this for classes only as it invokes _newmember
            }
        }
        if(separator == _SC(',')) //hack recognizes a table from the separator
            _fs->SetIntructionParam(tpos, 1, nkeys);
        Lex();
    }